

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

lest * __thiscall
lest::to_string<nonstd::optional_bare::optional<char>>(lest *this,optional<char> *value)

{
  string_maker<nonstd::optional_bare::optional<char>> local_38 [32];
  optional<char> *local_18;
  optional<char> *value_local;
  
  local_18 = value;
  value_local = (optional<char> *)this;
  string_maker<nonstd::optional_bare::optional<char>>::to_string_abi_cxx11_(local_38,value);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return this;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}